

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

PClassActor * __thiscall PClassActor::GetReplacee(PClassActor *this,bool lookskill)

{
  PClassActor *pPVar1;
  PClass *pPVar2;
  PClassActor *pPVar3;
  undefined7 in_register_00000031;
  undefined1 auVar4 [4];
  long lVar5;
  undefined1 local_48 [4];
  FName local_44;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  FName local_30;
  int local_2c;
  
  auVar4 = (undefined1  [4])0x0;
  if (((int)CONCAT71(in_register_00000031,lookskill) != 0) &&
     ((uint)gameskill.Value < AllSkills.Count)) {
    local_2c = (this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
    FSkillInfo::GetReplacedBy((FSkillInfo *)local_48,&AllSkills.Array[gameskill.Value].Name);
    auVar4 = local_48;
    lVar5 = (long)(int)local_48;
    if (lVar5 != 0) {
      local_30.Index = (int)local_48;
      pPVar2 = PClass::FindClass(&local_30);
      if (pPVar2 == (PClass *)0x0) {
        lookskill = false;
        Printf("Warning: incorrect actor name in definition of skill %s: \nnon-existent class %s is replaced by class %s\nSkill replacement will be ignored for this actor.\n"
               ,FName::NameData.NameArray[AllSkills.Array[gameskill.Value].Name.Index].Text,
               FName::NameData.NameArray[lVar5].Text,
               FName::NameData.NameArray
               [(this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
        local_34.Index = (this->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
        local_38.Index = 0;
        FSkillInfo::SetReplacedBy(AllSkills.Array + gameskill.Value,&local_34,&local_38);
        local_3c.Index = (int)auVar4;
        local_40.Index = 0;
        FSkillInfo::SetReplacement(AllSkills.Array + gameskill.Value,&local_3c,&local_40);
      }
    }
  }
  pPVar1 = this->Replacee;
  pPVar3 = this;
  if (((~lookskill | auVar4 == (undefined1  [4])0x0) & pPVar1 == (PClassActor *)0x0) == 0) {
    this->Replacee = (PClassActor *)0x0;
    pPVar3 = pPVar1;
    if (lookskill == true && auVar4 != (undefined1  [4])0x0) {
      local_44.Index = (int)auVar4;
      pPVar2 = PClass::FindClass(&local_44);
      if (pPVar2 != (PClass *)0x0) {
        local_48 = auVar4;
        pPVar2 = PClass::FindClass((FName *)local_48);
        pPVar3 = dyn_cast<PClassActor>((DObject *)pPVar2);
      }
    }
    pPVar3 = GetReplacee(pPVar3,false);
    this->Replacee = pPVar1;
  }
  return pPVar3;
}

Assistant:

PClassActor *PClassActor::GetReplacee(bool lookskill)
{
	FName skillrepname;
	
	if (lookskill && AllSkills.Size() > (unsigned)gameskill)
	{
		skillrepname = AllSkills[gameskill].GetReplacedBy(TypeName);
		if (skillrepname != NAME_None && PClass::FindClass(skillrepname) == NULL)
		{
			Printf("Warning: incorrect actor name in definition of skill %s: \n"
				   "non-existent class %s is replaced by class %s\n"
				   "Skill replacement will be ignored for this actor.\n", 
				   AllSkills[gameskill].Name.GetChars(), 
				   skillrepname.GetChars(), TypeName.GetChars());
			AllSkills[gameskill].SetReplacedBy(TypeName, NAME_None);
			AllSkills[gameskill].SetReplacement(skillrepname, NAME_None);
			lookskill = false; 
		}
	}
	if (Replacee == NULL && (!lookskill || skillrepname == NAME_None))
	{
		return this;
	}
	// The Replacee field is temporarily NULLed to prevent
	// potential infinite recursion.
	PClassActor *savedrep = Replacee;
	Replacee = NULL;
	PClassActor *rep = savedrep;
	if (lookskill && (skillrepname != NAME_None) && (PClass::FindClass(skillrepname) != NULL))
	{
		rep = PClass::FindActor(skillrepname);
	}
	rep = rep->GetReplacee(false);
	Replacee = savedrep;
	return rep;
}